

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
QueryCompiler::compileViews
          (QueryCompiler *this,TDNode *node,size_t destinationID,
          vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *aggregate,
          var_bitset freeVars)

{
  initializer_list<std::bitset<1500UL>_> __l;
  var_bitset freeVars_00;
  ulong uVar1;
  bool bVar2;
  pointer ppVar3;
  size_type sVar4;
  Attribute *pAVar5;
  undefined8 uVar6;
  reference ppFVar7;
  reference pvVar8;
  bitset<200UL> *pbVar9;
  mapped_type *pmVar10;
  void *pvVar11;
  ostream *poVar12;
  basic_ostream<char,_std::char_traits<char>_> *pbVar13;
  size_t sVar14;
  vector<View_*,_std::allocator<View_*>_> *this_00;
  pointer ppVar15;
  reference ppVVar16;
  value_type pVVar17;
  mapped_type *pmVar18;
  mapped_type *this_01;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *in_RCX;
  TDNode *in_RDX;
  QueryCompiler *in_RSI;
  _WordT in_RDI;
  _WordT in_R8;
  _WordT in_R9;
  pair<unsigned_long,_unsigned_long> pVar19;
  pair<int,_unsigned_long> pVar20;
  pair<unsigned_long,_int> pVar21;
  iterator view_it;
  view_tuple vt;
  View *view;
  var_bitset neighborFreeVars;
  TDNode *neighbor;
  size_t other;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> childAgg;
  size_t n;
  size_t other_prod;
  agg_bitset candidate;
  agg_bitset merges;
  bool mergable;
  size_t neigh;
  size_t prod_3;
  pair<const_std::bitset<1500UL>,_std::bitset<200UL>_> *localAgg_1;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
  *__range1;
  size_t localAggIndex;
  Aggregate *agg;
  pair<const_std::bitset<1500UL>,_std::bitset<200UL>_> *localAgg;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
  *__range2;
  size_t localAggIndex_1;
  iterator it_1;
  prod_bitset localAggregate;
  size_t f_1;
  prod_bitset forcedLocal;
  size_t prod_2;
  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
  localAggMap;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> pushDownFreeVars;
  size_t c;
  bool pushedDown;
  var_bitset *fVars;
  size_t i_2;
  size_t prod_1;
  prod_bitset presentFunctions;
  prod_bitset remainderMask;
  prod_bitset forcedLocalFunctions;
  prod_bitset localMask;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> pushDownMask;
  size_t i_1;
  Function *func;
  size_t f;
  value_type *prod;
  size_t i;
  size_t aggIdx;
  string aggString;
  iterator it;
  cache_tuple t;
  bool print;
  pair<unsigned_long,_unsigned_long> viewAggregatePair;
  value_type *in_stack_ffffffffffffee58;
  undefined4 in_stack_ffffffffffffee60;
  int in_stack_ffffffffffffee64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee68;
  undefined4 in_stack_ffffffffffffee70;
  int in_stack_ffffffffffffee74;
  unsigned_long *in_stack_ffffffffffffee78;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *in_stack_ffffffffffffee80;
  allocator_type *in_stack_ffffffffffffee88;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *in_stack_ffffffffffffee90;
  undefined4 in_stack_ffffffffffffee98;
  undefined4 in_stack_ffffffffffffee9c;
  size_type in_stack_ffffffffffffeea0;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *in_stack_ffffffffffffeea8;
  unsigned_long in_stack_ffffffffffffeeb0;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *this_02;
  bitset<1500UL> *in_stack_ffffffffffffeeb8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffeec0;
  TDNode *in_stack_ffffffffffffeec8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffeed0;
  reference in_stack_ffffffffffffef20;
  pair<unsigned_long,_int> local_f70;
  long local_f60;
  pair<int,_unsigned_long> local_f58;
  _Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
  local_f48;
  _Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
  local_f40 [8];
  value_type local_f00;
  _WordT local_ef8;
  _WordT _Stack_ef0;
  pair<unsigned_long,_unsigned_long> local_ed0;
  _Base_bitset<2UL> local_ec0;
  _Base_bitset<2UL> local_eb0;
  _Base_bitset<2UL> local_ea0;
  _Base_bitset<2UL> local_e90;
  TDNode *local_e80;
  reference local_db8;
  ulong local_da8;
  undefined1 local_d98 [192];
  undefined1 *local_cd8;
  undefined8 local_cd0;
  pointer local_cb0;
  reference local_828;
  ulong local_818;
  _WordT local_810;
  _WordT local_808;
  _WordT local_800;
  _WordT local_7f8;
  byte local_7c9;
  pointer local_7c8;
  reference local_7c0;
  ulong local_7b0;
  reference local_7a8;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false> local_7a0;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false> local_798;
  undefined1 *local_790;
  ulong local_788;
  void *local_780;
  reference local_778;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false> local_770;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false> local_768;
  undefined1 *local_760;
  ulong local_758;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false> local_730;
  _Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
  local_728 [25];
  _Base_bitset<2UL> local_660;
  _Base_bitset<2UL> local_650;
  reference local_640;
  ulong local_630;
  ulong local_568;
  undefined1 local_560 [64];
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> local_520;
  _Base_bitset<2UL> local_508;
  pointer local_4f8;
  _Base_bitset<2UL> local_4f0;
  byte local_4d9;
  value_type local_4d8;
  reference local_4d0;
  ulong local_4c0;
  ulong local_4b8;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_1a8;
  ulong local_190;
  string local_188 [32];
  string local_168 [32];
  string local_148 [32];
  Function *local_128;
  ulong local_120;
  reference local_118;
  ulong local_110;
  size_type local_108;
  allocator local_f9;
  string local_f8 [36];
  undefined4 local_d4;
  _Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
  local_d0 [3];
  _Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
  local_b8 [14];
  undefined7 in_stack_ffffffffffffffb8;
  byte bVar22;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *destinationID_00;
  _WordT _Var23;
  pair<unsigned_long,_unsigned_long> local_10;
  
  bVar22 = 0;
  destinationID_00 = in_RCX;
  _Var23 = in_RDI;
  std::
  make_tuple<unsigned_long&,unsigned_long&,std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>&,std::bitset<100ul>&>
            (in_stack_ffffffffffffee78,
             (unsigned_long *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
             (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
             in_stack_ffffffffffffee68,
             (bitset<100UL> *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
  std::
  tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  ::
  tuple<unsigned_long,_unsigned_long,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>,_true,_true>
            ((tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
              *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
             (tuple<unsigned_long,_unsigned_long,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
              *)in_stack_ffffffffffffee58);
  std::
  tuple<unsigned_long,_unsigned_long,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  ::~tuple((tuple<unsigned_long,_unsigned_long,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
            *)0x316b42);
  local_b8[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
       ::find((unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
               *)in_stack_ffffffffffffee58,(key_type *)0x316b5b);
  local_d0[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
       ::end((unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
              *)in_stack_ffffffffffffee58);
  bVar2 = std::__detail::operator!=(local_b8,local_d0);
  if (bVar2) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_false,_true>
                           *)0x316bdb);
    std::pair<unsigned_long,_unsigned_long>::pair<int,_int,_true>(&local_10,&ppVar3->second);
    local_d4 = 1;
  }
  else {
    if ((bVar22 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8," ",&local_f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      local_108 = 0;
      for (local_110 = 0; uVar1 = local_110,
          sVar4 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                            (in_RCX), uVar1 < sVar4; local_110 = local_110 + 1) {
        local_118 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](in_RCX,local_108);
        for (local_120 = 0; local_120 < 0x5dc; local_120 = local_120 + 1) {
          bVar2 = std::bitset<1500UL>::test
                            ((bitset<1500UL> *)
                             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                             (size_t)in_stack_ffffffffffffee58);
          if (bVar2) {
            local_128 = getFunction((QueryCompiler *)
                                    CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                    (size_t)in_stack_ffffffffffffee58);
            std::__cxx11::to_string(CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
            std::operator+((char *)in_stack_ffffffffffffee68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
            std::operator+(in_stack_ffffffffffffee68,
                           (char *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
            std::__cxx11::string::operator+=(local_f8,local_148);
            std::__cxx11::string::~string(local_148);
            std::__cxx11::string::~string(local_168);
            std::__cxx11::string::~string(local_188);
            for (local_190 = 0; local_190 < 100; local_190 = local_190 + 1) {
              bVar2 = std::bitset<100UL>::test
                                ((bitset<100UL> *)
                                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                 (size_t)in_stack_ffffffffffffee58);
              if (bVar2) {
                std::
                __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x316e05);
                pAVar5 = TreeDecomposition::getAttribute
                                   ((TreeDecomposition *)
                                    CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                    (size_t)in_stack_ffffffffffffee68);
                std::__cxx11::string::operator+=(local_f8,(string *)&pAVar5->_name);
              }
            }
            std::__cxx11::string::operator+=(local_f8,")*");
          }
        }
        std::__cxx11::string::pop_back();
        std::__cxx11::string::operator+=(local_f8," + ");
        local_108 = local_108 + 1;
      }
      std::__cxx11::string::pop_back();
      uVar6 = std::__cxx11::string::c_str();
      printf("%s\n",uVar6);
      std::__cxx11::string::~string(local_f8);
    }
    std::allocator<std::bitset<1500UL>_>::allocator((allocator<std::bitset<1500UL>_> *)0x31700f);
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
              ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
               in_stack_ffffffffffffee80,(size_type)in_stack_ffffffffffffee78,
               (allocator_type *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70));
    std::allocator<std::bitset<1500UL>_>::~allocator((allocator<std::bitset<1500UL>_> *)0x31703b);
    std::bitset<1500UL>::bitset((bitset<1500UL> *)0x317048);
    std::bitset<1500UL>::bitset((bitset<1500UL> *)0x317055);
    std::bitset<1500UL>::bitset((bitset<1500UL> *)0x317062);
    std::bitset<1500UL>::bitset((bitset<1500UL> *)0x31706f);
    for (local_4b8 = 0; uVar1 = local_4b8,
        sVar4 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                          (in_RCX), uVar1 < sVar4; local_4b8 = local_4b8 + 1) {
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                (in_RCX,local_4b8);
      std::bitset<1500UL>::operator|=
                ((bitset<1500UL> *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (bitset<1500UL> *)in_stack_ffffffffffffee58);
    }
    for (local_4c0 = 0; local_4c0 < 0x5dc; local_4c0 = local_4c0 + 1) {
      std::bitset<1500UL>::operator[]
                ((bitset<1500UL> *)in_stack_ffffffffffffee68,
                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      bVar2 = std::bitset::reference::operator_cast_to_bool
                        ((reference *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60))
      ;
      std::bitset<1500UL>::reference::~reference(&local_4d0);
      if (bVar2) {
        ppFVar7 = std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                            ((vector<Function_*,_std::allocator<Function_*>_> *)(in_RDI + 0x40),
                             local_4c0);
        local_4d8 = *ppFVar7;
        local_4d9 = 0;
        local_4f0._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_ffffffffffffee58,(bitset<100UL> *)0x3171bc);
        bVar2 = std::bitset<100UL>::operator==
                          ((bitset<100UL> *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (bitset<100UL> *)in_stack_ffffffffffffee58);
        if (bVar2) {
          std::bitset<1500UL>::set
                    ((bitset<1500UL> *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70)
                     ,(size_t)in_stack_ffffffffffffee68,
                     SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
        }
        else {
          for (local_4f8 = (pointer)0x0;
              local_4f8 <
              (in_RSI->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
              super__Vector_impl_data._M_finish; local_4f8 = (pointer)((long)local_4f8 + 1)) {
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &(in_RSI->_viewList).
                                 super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(size_type)local_4f8);
            if ((TDNode *)*pvVar8 != in_RDX) {
              local_508._M_w =
                   (_WordT  [2])
                   std::operator&((bitset<100UL> *)in_stack_ffffffffffffee58,
                                  (bitset<100UL> *)0x317299);
              bVar2 = std::bitset<100UL>::operator==
                                ((bitset<100UL> *)
                                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                 (bitset<100UL> *)in_stack_ffffffffffffee58);
              if (bVar2) {
                std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                          (&local_1a8,(size_type)local_4f8);
                std::bitset<1500UL>::set
                          ((bitset<1500UL> *)
                           CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                           (size_t)in_stack_ffffffffffffee68,
                           SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
                std::bitset<1500UL>::set
                          ((bitset<1500UL> *)
                           CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                           (size_t)in_stack_ffffffffffffee68,
                           SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
                local_4d9 = 1;
                break;
              }
            }
          }
          if ((local_4d9 & 1) == 0) {
            std::bitset<1500UL>::set
                      ((bitset<1500UL> *)
                       CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                       (size_t)in_stack_ffffffffffffee68,
                       SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
            std::bitset<1500UL>::set
                      ((bitset<1500UL> *)
                       CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                       (size_t)in_stack_ffffffffffffee68,
                       SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
          }
        }
      }
    }
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size(in_RCX);
    std::allocator<std::bitset<100UL>_>::allocator((allocator<std::bitset<100UL>_> *)0x3173c0);
    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::vector
              (in_stack_ffffffffffffee80,(size_type)in_stack_ffffffffffffee78,
               (value_type *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
               (allocator_type *)in_stack_ffffffffffffee68);
    std::allocator<std::bitset<100UL>_>::~allocator((allocator<std::bitset<100UL>_> *)0x3173f4);
    std::
    unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
    ::unordered_map((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                     *)0x317401);
    for (local_568 = 0; uVar1 = local_568,
        sVar4 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                          (in_RCX), uVar1 < sVar4; local_568 = local_568 + 1) {
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                (in_RCX,local_568);
      std::operator&((bitset<1500UL> *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70)
                     ,(bitset<1500UL> *)in_stack_ffffffffffffee68);
      for (local_630 = 0; local_630 < 0x5dc; local_630 = local_630 + 1) {
        std::bitset<1500UL>::operator[]
                  ((bitset<1500UL> *)in_stack_ffffffffffffee68,
                   CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
        std::bitset<1500UL>::reference::~reference(&local_640);
        if (bVar2) {
          std::vector<Function_*,_std::allocator<Function_*>_>::operator[]
                    ((vector<Function_*,_std::allocator<Function_*>_> *)(in_RDI + 0x40),local_630);
          local_660._M_w =
               (_WordT  [2])
               std::bitset<100UL>::operator~((bitset<100UL> *)in_stack_ffffffffffffee68);
          local_650._M_w =
               (_WordT  [2])
               std::operator&((bitset<100UL> *)in_stack_ffffffffffffee58,(bitset<100UL> *)0x317533);
          std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                    (&local_520,local_568);
          std::bitset<100UL>::operator|=
                    ((bitset<100UL> *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                     (bitset<100UL> *)in_stack_ffffffffffffee58);
        }
      }
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                (in_RCX,local_568);
      std::operator&((bitset<1500UL> *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70)
                     ,(bitset<1500UL> *)in_stack_ffffffffffffee68);
      local_728[0]._M_cur =
           (__node_type *)
           std::
           unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
           ::find((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                   *)in_stack_ffffffffffffee58,(key_type *)0x31760e);
      local_730._M_cur =
           (__node_type *)
           std::
           unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
           ::end((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                  *)in_stack_ffffffffffffee58);
      bVar2 = std::__detail::operator!=(local_728,&local_730);
      if (bVar2) {
        std::__detail::
        _Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>::
        operator->((_Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                    *)0x317665);
        std::bitset<200UL>::set
                  ((bitset<200UL> *)CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                   (size_t)in_stack_ffffffffffffee68,
                   SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
      }
      else {
        std::bitset<200UL>::bitset((bitset<200UL> *)0x31769d);
        pbVar9 = std::bitset<200UL>::set
                           ((bitset<200UL> *)
                            CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                            (size_t)in_stack_ffffffffffffee68,
                            SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
        pmVar10 = std::
                  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                  ::operator[]((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (key_type *)in_stack_ffffffffffffee58);
        (pmVar10->super__Base_bitset<4UL>)._M_w[0] = (pbVar9->super__Base_bitset<4UL>)._M_w[0];
        (pmVar10->super__Base_bitset<4UL>)._M_w[1] = (pbVar9->super__Base_bitset<4UL>)._M_w[1];
        (pmVar10->super__Base_bitset<4UL>)._M_w[2] = (pbVar9->super__Base_bitset<4UL>)._M_w[2];
        (pmVar10->super__Base_bitset<4UL>)._M_w[3] = (pbVar9->super__Base_bitset<4UL>)._M_w[3];
      }
    }
    if ((bVar22 & 1) != 0) {
      local_758 = 0;
      local_760 = local_560;
      local_768._M_cur =
           (__node_type *)
           std::
           unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
           ::begin((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                    *)in_stack_ffffffffffffee58);
      local_770._M_cur =
           (__node_type *)
           std::
           unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
           ::end((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                  *)in_stack_ffffffffffffee58);
      while (bVar2 = std::__detail::operator!=(&local_768,&local_770), bVar2) {
        local_778 = std::__detail::
                    _Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                    ::operator*((_Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                                 *)0x3177a8);
        uVar1 = local_758;
        local_758 = local_758 + 1;
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
        std::operator<<(poVar12," : ");
        pbVar13 = std::operator<<(in_stack_ffffffffffffeec0,in_stack_ffffffffffffeeb8);
        std::operator<<((ostream *)pbVar13," -> ");
        pbVar13 = std::operator<<(in_stack_ffffffffffffeed0,
                                  (bitset<200UL> *)in_stack_ffffffffffffeec8);
        std::ostream::operator<<((ostream *)pbVar13,std::endl<char,std::char_traits<char>>);
        std::__detail::
        _Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                    *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
      }
    }
    pvVar11 = operator_new(0x30);
    Aggregate::Aggregate((Aggregate *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60))
    ;
    local_788 = 0;
    local_790 = local_560;
    local_780 = pvVar11;
    local_798._M_cur =
         (__node_type *)
         std::
         unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
         ::begin((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                  *)in_stack_ffffffffffffee58);
    local_7a0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
         ::end((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                *)in_stack_ffffffffffffee58);
    pVar19.second = in_stack_ffffffffffffeeb0;
    pVar19.first = (unsigned_long)in_stack_ffffffffffffeeb8;
    while( true ) {
      bVar2 = std::__detail::operator!=(&local_798,&local_7a0);
      if (!bVar2) break;
      local_7a8 = std::__detail::
                  _Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                  ::operator*((_Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                               *)0x31792d);
      uVar1 = local_788;
      if ((bVar22 & 1) != 0) {
        local_788 = local_788 + 1;
        poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
        std::operator<<(poVar12," : ");
        pbVar13 = std::operator<<(in_stack_ffffffffffffeec0,(bitset<1500UL> *)pVar19.first);
        std::operator<<((ostream *)pbVar13," -> ");
        pbVar13 = std::operator<<(in_stack_ffffffffffffeed0,
                                  (bitset<200UL> *)in_stack_ffffffffffffeec8);
        std::ostream::operator<<((ostream *)pbVar13,std::endl<char,std::char_traits<char>>);
      }
      for (local_7b0 = 0; local_7b0 < 200; local_7b0 = local_7b0 + 1) {
        std::bitset<200UL>::operator[]
                  ((bitset<200UL> *)in_stack_ffffffffffffee68,
                   CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
        bVar2 = std::bitset::reference::operator_cast_to_bool
                          ((reference *)
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
        std::bitset<200UL>::reference::~reference(&local_7c0);
        if (bVar2) {
          if ((bVar22 & 1) != 0) {
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_7b0);
            std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          }
          std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                    ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                     CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                     (value_type *)in_stack_ffffffffffffee68);
          local_7c8 = (pointer)0x0;
          local_7c9 = 0;
          std::bitset<200UL>::bitset((bitset<200UL> *)0x317b1b);
          local_810 = (local_7a8->second).super__Base_bitset<4UL>._M_w[0];
          local_808 = (local_7a8->second).super__Base_bitset<4UL>._M_w[1];
          local_800 = (local_7a8->second).super__Base_bitset<4UL>._M_w[2];
          local_7f8 = (local_7a8->second).super__Base_bitset<4UL>._M_w[3];
          sVar14 = std::bitset<200UL>::count((bitset<200UL> *)0x317b73);
          if (1 < sVar14) {
            for (local_7c8 = (pointer)0x0; uVar1 = local_7b0,
                local_7c8 <
                (in_RSI->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                super__Vector_impl_data._M_finish; local_7c8 = (pointer)((long)local_7c8 + 1)) {
              while (local_818 = uVar1 + 1, local_818 < 200) {
                std::bitset<200UL>::operator[]
                          ((bitset<200UL> *)in_stack_ffffffffffffee68,
                           CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
                bVar2 = std::bitset::reference::operator_cast_to_bool
                                  ((reference *)
                                   CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
                std::bitset<200UL>::reference::~reference(&local_828);
                uVar1 = local_818;
                if (bVar2) {
                  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                  operator[](in_RCX,local_7b0);
                  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                  operator[](&local_1a8,(size_type)local_7c8);
                  std::operator&((bitset<1500UL> *)
                                 CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                 (bitset<1500UL> *)in_stack_ffffffffffffee68);
                  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                  operator[](in_RCX,local_818);
                  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                  operator[](&local_1a8,(size_type)local_7c8);
                  std::operator&((bitset<1500UL> *)
                                 CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                 (bitset<1500UL> *)in_stack_ffffffffffffee68);
                  bVar2 = std::bitset<1500UL>::operator!=
                                    ((bitset<1500UL> *)
                                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                     (bitset<1500UL> *)in_stack_ffffffffffffee58);
                  uVar1 = local_818;
                  if (bVar2) {
                    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](in_RCX,local_7b0);
                    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](&local_1a8,(size_type)local_7c8);
                    std::bitset<1500UL>::operator~(in_stack_ffffffffffffef20);
                    std::operator&((bitset<1500UL> *)
                                   CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                   (bitset<1500UL> *)in_stack_ffffffffffffee68);
                    in_stack_ffffffffffffef20 =
                         std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                         operator[](in_RCX,local_818);
                    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](&local_1a8,(size_type)local_7c8);
                    std::bitset<1500UL>::operator~(in_stack_ffffffffffffef20);
                    std::operator&((bitset<1500UL> *)
                                   CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                   (bitset<1500UL> *)in_stack_ffffffffffffee68);
                    bVar2 = std::bitset<1500UL>::operator==
                                      ((bitset<1500UL> *)
                                       CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60)
                                       ,(bitset<1500UL> *)in_stack_ffffffffffffee58);
                    if (bVar2) {
                      std::bitset<200UL>::set
                                ((bitset<200UL> *)
                                 CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                 (size_t)in_stack_ffffffffffffee68,
                                 SUB41((uint)in_stack_ffffffffffffee64 >> 0x18,0));
                      local_7c9 = 1;
                    }
                    std::bitset<200UL>::reset
                              ((bitset<200UL> *)
                               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (size_t)in_stack_ffffffffffffee58);
                    uVar1 = local_818;
                  }
                }
              }
              if ((local_7c9 & 1) != 0) break;
            }
          }
          for (local_cb0 = (pointer)0x0;
              local_cb0 <
              (in_RSI->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
              super__Vector_impl_data._M_finish; local_cb0 = (pointer)((long)local_cb0 + 1)) {
            pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                &(in_RSI->_viewList).
                                 super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,(size_type)local_cb0);
            if ((TDNode *)*pvVar8 != in_RDX) {
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                        (in_RCX,local_7b0);
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
                        (&local_1a8,(size_type)local_cb0);
              std::operator&((bitset<1500UL> *)
                             CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                             (bitset<1500UL> *)in_stack_ffffffffffffee68);
              local_cd0 = 1;
              local_cd8 = local_d98;
              std::allocator<std::bitset<1500UL>_>::allocator
                        ((allocator<std::bitset<1500UL>_> *)0x317efa);
              __l._M_array._4_4_ = in_stack_ffffffffffffee9c;
              __l._M_array._0_4_ = in_stack_ffffffffffffee98;
              __l._M_len = in_stack_ffffffffffffeea0;
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                        (in_stack_ffffffffffffee90,__l,in_stack_ffffffffffffee88);
              std::allocator<std::bitset<1500UL>_>::~allocator
                        ((allocator<std::bitset<1500UL>_> *)0x317f2e);
              if (((local_7c9 & 1) != 0) && (local_cb0 == local_7c8)) {
                for (local_da8 = 0; local_da8 < 200; local_da8 = local_da8 + 1) {
                  std::bitset<200UL>::operator[]
                            ((bitset<200UL> *)in_stack_ffffffffffffee68,
                             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
                  bVar2 = std::bitset::reference::operator_cast_to_bool
                                    ((reference *)
                                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
                  std::bitset<200UL>::reference::~reference(&local_db8);
                  if (bVar2) {
                    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](in_RCX,local_da8);
                    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    operator[](&local_1a8,(size_type)local_cb0);
                    std::operator&((bitset<1500UL> *)
                                   CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                                   (bitset<1500UL> *)in_stack_ffffffffffffee68);
                    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::
                    push_back((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                              CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                              (value_type *)in_stack_ffffffffffffee58);
                    std::bitset<200UL>::reset
                              ((bitset<200UL> *)
                               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (size_t)in_stack_ffffffffffffee58);
                  }
                }
              }
              std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x3180b2);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         &(in_RSI->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)local_cb0);
              local_e80 = TreeDecomposition::getRelation
                                    ((TreeDecomposition *)
                                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                     (size_t)in_stack_ffffffffffffee58);
              std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
                        (&local_520,local_7b0);
              local_eb0._M_w =
                   (_WordT  [2])
                   std::operator|((bitset<100UL> *)in_stack_ffffffffffffee58,
                                  (bitset<100UL> *)0x318122);
              local_ea0._M_w =
                   (_WordT  [2])
                   std::operator&((bitset<100UL> *)in_stack_ffffffffffffee58,
                                  (bitset<100UL> *)0x31815a);
              local_ec0._M_w =
                   (_WordT  [2])
                   std::operator&((bitset<100UL> *)in_stack_ffffffffffffee58,
                                  (bitset<100UL> *)0x318187);
              this_02 = (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                        pVar19.second;
              local_e90._M_w =
                   (_WordT  [2])
                   std::operator|((bitset<100UL> *)in_stack_ffffffffffffee58,
                                  (bitset<100UL> *)0x3181ac);
              in_stack_ffffffffffffeec0 =
                   (basic_ostream<char,_std::char_traits<char>_> *)((long)local_780 + 0x18);
              in_stack_ffffffffffffeed0 =
                   (basic_ostream<char,_std::char_traits<char>_> *)
                   (in_RSI->_queryList).super__Vector_base<Query_*,_std::allocator<Query_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
              in_stack_ffffffffffffeec8 = local_e80;
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                        (this_02,in_stack_ffffffffffffeea8);
              local_ef8 = local_e90._M_w[0];
              _Stack_ef0 = local_e90._M_w[1];
              freeVars_00.super__Base_bitset<2UL>._M_w[1] = in_R8;
              freeVars_00.super__Base_bitset<2UL>._M_w[0] = _Var23;
              pVar19 = compileViews(in_RSI,in_RDX,(size_t)destinationID_00,
                                    (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                     *)CONCAT17(bVar22,in_stack_ffffffffffffffb8),freeVars_00);
              local_ed0 = pVar19;
              std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                          in_stack_ffffffffffffee58);
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~vector
                        ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                         CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70));
              std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~vector
                        ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                         CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70));
            }
          }
        }
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false,_false>
                  *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60));
    }
    std::make_tuple<unsigned_long&,unsigned_long&,std::bitset<100ul>&>
              ((unsigned_long *)in_stack_ffffffffffffee68,
               (unsigned_long *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
               (bitset<100UL> *)in_stack_ffffffffffffee58);
    std::tuple<int,_int,_std::bitset<100UL>_>::
    tuple<unsigned_long,_unsigned_long,_std::bitset<100UL>,_true,_true>
              ((tuple<int,_int,_std::bitset<100UL>_> *)
               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
               (tuple<unsigned_long,_unsigned_long,_std::bitset<100UL>_> *)in_stack_ffffffffffffee58
              );
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>(&local_10);
    local_f40[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
         ::find((unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
                 *)in_stack_ffffffffffffee58,(key_type *)0x318381);
    local_f48._M_cur =
         (__node_type *)
         std::
         unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
         ::end((unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
                *)in_stack_ffffffffffffee58);
    bVar2 = std::__detail::operator!=(local_f40,&local_f48);
    if (bVar2) {
      this_00 = (vector<View_*,_std::allocator<View_*>_> *)(in_RDI + 0x28);
      ppVar15 = std::__detail::
                _Node_iterator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_false,_true>
                ::operator->((_Node_iterator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_false,_true>
                              *)0x3183ed);
      ppVVar16 = std::vector<View_*,_std::allocator<View_*>_>::operator[]
                           (this_00,(long)ppVar15->second);
      local_f00 = *ppVVar16;
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                 CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                 (value_type *)in_stack_ffffffffffffee68);
      std::__detail::
      _Node_iterator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_false,_true>::
      operator->((_Node_iterator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_false,_true>
                  *)0x31842e);
      sVar4 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size(&local_f00->_aggregates);
      local_f60 = sVar4 - 1;
      pVar20 = std::make_pair<int&,unsigned_long>
                         ((int *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                          &in_stack_ffffffffffffee58->first);
      local_f58.second = pVar20.second;
      local_f58.first = pVar20.first;
      std::pair<unsigned_long,unsigned_long>::operator=
                ((pair<unsigned_long,unsigned_long> *)&local_10,&local_f58);
    }
    else {
      pVVar17 = (value_type)operator_new(0x38);
      View::View((View *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (int)((ulong)in_stack_ffffffffffffee58 >> 0x20),(int)in_stack_ffffffffffffee58);
      (pVVar17->_fVars).super__Base_bitset<2UL>._M_w[0] = in_R8;
      (pVVar17->_fVars).super__Base_bitset<2UL>._M_w[1] = in_R9;
      local_f00 = pVVar17;
      std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::push_back
                ((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                 CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                 (value_type *)in_stack_ffffffffffffee68);
      std::vector<View_*,_std::allocator<View_*>_>::push_back
                ((vector<View_*,_std::allocator<View_*>_> *)
                 CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70),
                 (value_type *)in_stack_ffffffffffffee68);
      sVar4 = std::vector<View_*,_std::allocator<View_*>_>::size
                        ((vector<View_*,_std::allocator<View_*>_> *)(in_RDI + 0x28));
      in_stack_ffffffffffffee74 = (int)sVar4 + -1;
      pmVar18 = std::
                unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
                ::operator[]((unordered_map<std::tuple<int,_int,_std::bitset<100UL>_>,_int,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>_>
                              *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                             (key_type *)in_stack_ffffffffffffee58);
      *pmVar18 = in_stack_ffffffffffffee74;
      std::vector<View_*,_std::allocator<View_*>_>::size
                ((vector<View_*,_std::allocator<View_*>_> *)(in_RDI + 0x28));
      pVar21 = std::make_pair<unsigned_long,int>
                         ((unsigned_long *)
                          CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                          (int *)in_stack_ffffffffffffee58);
      local_f70.first = pVar21.first;
      in_stack_ffffffffffffee64 = pVar21.second;
      local_f70.second = in_stack_ffffffffffffee64;
      std::pair<unsigned_long,unsigned_long>::operator=
                ((pair<unsigned_long,unsigned_long> *)&local_10,&local_f70);
    }
    this_01 = std::
              unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
              ::operator[]((unordered_map<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                           (key_type *)in_stack_ffffffffffffee58);
    std::pair<int,int>::operator=((pair<int,int> *)this_01,&local_10);
    local_d4 = 1;
    std::
    unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
    ::~unordered_map((unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
                      *)0x31866f);
    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::~vector
              ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
               CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70));
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::~vector
              ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
               CONCAT44(in_stack_ffffffffffffee74,in_stack_ffffffffffffee70));
  }
  std::
  tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
  ::~tuple((tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>
            *)0x3186c1);
  return local_10;
}

Assistant:

pair<size_t,size_t> QueryCompiler::compileViews(TDNode* node, size_t destinationID,
                                   vector<prod_bitset> aggregate, var_bitset freeVars)
{
    bool print = false;
    
    /* Check if the required view has already been declared - if so reuse this one */
    cache_tuple t = make_tuple(node->_id, destinationID, aggregate, freeVars);
    auto it = _cache.find(t);
    if (it != _cache.end())
    {
        if (print) 
            DINFO("We reused an existing view. \n");      
        return it->second;
    }

    
    if (print)
    {
        DINFO("\nBeginning compileViews at node " + to_string(node->_id) + " destination "+
              to_string(destinationID) + " freeVars: " + freeVars.to_string() +
              " number of products: " + to_string(aggregate.size()) +"\n");

        std::string aggString = " ";
        size_t aggIdx = 0;
        for (size_t i = 0; i < aggregate.size(); i++) {
            const auto &prod = aggregate[aggIdx];
            for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++) {
                if (prod.test(f)) {
                    Function* func = getFunction(f);
                    aggString += "f_"+to_string(f)+"(";
                    for (size_t i = 0; i < NUM_OF_VARIABLES; i++)
                        if (func->_fVars.test(i))
                            aggString += _td->getAttribute(i)->_name;
                    aggString += ")*";
                }
            }
            aggString.pop_back();
            aggString += " + ";
            ++aggIdx;
        }
        aggString.pop_back();
        printf("%s\n", aggString.c_str());
    }
    
    vector<prod_bitset> pushDownMask(node->_numOfNeighbors);
    prod_bitset localMask, forcedLocalFunctions, remainderMask, presentFunctions;

    // Find all functions in the aggregate 
    for (size_t prod = 0; prod < aggregate.size(); prod++)
        presentFunctions |= aggregate[prod];

    for (size_t i = 0; i < NUM_OF_FUNCTIONS; i++)
    {
        if (presentFunctions[i])
        {            
            const var_bitset& fVars = _functionList[i]->_fVars;
            bool pushedDown = false;

            /*
             * Check if that function is included in the local bag
             * - if so, then we do not push it down 
             */
            if ((node->_bag & fVars) == fVars)
            {
                /* Leave it here as local computation */
                localMask.set(i);
            }
            else
            {
                /* For each child of current node */
                for (size_t c = 0; c < node->_numOfNeighbors; c++)
                {
                    /* chekc that this neighbor is not the destination */
                    if (node->_neighbors[c] != destinationID)
                    {
                        /* childSchema contains the function then push down */
                        if ((node->_neighborSchema[c] & fVars) == fVars)
                        {
                            /* push it to this child */
                            pushDownMask[c].set(i);
                            remainderMask.set(i);
                            pushedDown = true;
                            break;
                        }
                    }
                }

                if (!pushedDown)
                {
                    /* Leave it here as local computation */
                    localMask.set(i);
                    forcedLocalFunctions.set(i);
                }
            }
        }
    }
    
    vector<var_bitset> pushDownFreeVars(aggregate.size(), freeVars);
    
    std::unordered_map<prod_bitset, agg_bitset> localAggMap;


    /* 
     * For each product - split the functions into the ones that are pushed down
     * and the local functions 
     */
    for (size_t prod = 0; prod < aggregate.size(); prod++)
    {
        // Add freeVars that do not exist in local bag to pushDownFreeVars
        prod_bitset forcedLocal = aggregate[prod] & forcedLocalFunctions;
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (forcedLocal[f])
            {
                pushDownFreeVars[prod] |=
                    _functionList[f]->_fVars & ~node->_bag;
            }
        }
        
        prod_bitset localAggregate = aggregate[prod] & localMask;
        
        // add this product to localAggregates
        auto it = localAggMap.find(localAggregate);
        if (it != localAggMap.end())
        {
            it->second.set(prod);
        }
        else
        {
            localAggMap[localAggregate] = agg_bitset().set(prod);
        }
    }
  
    if (print)
    {
        size_t localAggIndex = 0;
        for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
    }


    Aggregate* agg = new Aggregate();

    /* 
     * We now computed the local aggregates and the groups of products they
     * correspond to - now we check if we can merge several products before the
     * recursion 
     */
    size_t localAggIndex = 0;
    for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
    {
        if (print)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
        
        for (size_t prod = 0; prod < NUM_OF_PRODUCTS; ++prod)
        {
            if (localAgg.second[prod])
            {
                if (print)
                    std::cout << prod << std::endl;
                
                // Push local aggregate on aggregate
                agg->_agg.push_back(localAgg.first);
                
                size_t neigh = 0;
                bool mergable = false;

                // Check if we can merge some of the products that need to be
                // computed below
                agg_bitset merges, candidate = localAgg.second;

                if (localAgg.second.count() > 1)
                {
                    for (neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
                    {
                        for (size_t other_prod = prod+1; other_prod < NUM_OF_PRODUCTS;
                             ++other_prod)
                        {
                            if (candidate[other_prod])
                            {
                                if ((aggregate[prod] & pushDownMask[neigh]) !=
                                    (aggregate[other_prod] & pushDownMask[neigh]))
                                {
                                    if ((aggregate[prod] & ~pushDownMask[neigh]) ==
                                        (aggregate[other_prod] & ~pushDownMask[neigh]))
                                    {
                                        merges.set(other_prod);
                                        mergable = true;
                                    }

                                    candidate.reset(other_prod);
                                }
                            }
                        }

                        if (mergable)
                            break;                        
                    }
                }

                // For each neighbor compile the (merged) views and push to incoming
                for (size_t n = 0; n < node->_numOfNeighbors; ++n)
                {
                    if (node->_neighbors[n] != destinationID)
                    {
                        vector<prod_bitset> childAgg =
                            {aggregate[prod] & pushDownMask[n]};
                        
                        if (mergable && n == neigh)
                        {  
                            for (size_t other = 0; other < NUM_OF_PRODUCTS; ++other)
                            {
                                if (merges[other])
                                {     
                                    /* Add mergable products to this array */
                                    childAgg.push_back(
                                        aggregate[other] & pushDownMask[n]);
                                    
                                    /* And unset for the flag in localAgg.second */
                                    localAgg.second.reset(other);
                                }
                            }
                        }

                        TDNode* neighbor = _td->getRelation(node->_neighbors[n]);

                        var_bitset neighborFreeVars =
                            ((freeVars | pushDownFreeVars[prod]) &
                             node->_neighborSchema[n]) |
                            (neighbor->_bag & node->_bag);

                        /* Recursive call for the next child */ 
                        agg->_incoming.push_back(
                             compileViews(neighbor, node->_id, childAgg, neighborFreeVars));
                    }
                }
            }
        }
    }

    /* 
     * Check here if a View with the same node, destination and freeVars exists 
     * if so then we want to append this aggregate to the exisiting view
     */
    View* view;
    view_tuple vt = make_tuple(node->_id, destinationID, freeVars);
    pair<size_t, size_t> viewAggregatePair;
    
    auto view_it = _viewCache.find(vt);
    if (view_it != _viewCache.end())
    {
        /* If the required view has already been declared, we append the
         * aggregate to this view 
         */

        view = _viewList[view_it->second];
        
        view->_aggregates.push_back(agg);

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(view_it->second, view->_aggregates.size()-1);
    }
    else
    {
        /* 
         * If the required view has not already been declared, we construct a
         * new view and the aggregate to it
         */
        view = new View(node->_id, destinationID);
        
        view->_fVars = freeVars;
        view->_aggregates.push_back(agg);

        /* Adding local view to the list of views */
        _viewList.push_back(view);

        /* Cache this view structure */
        _viewCache[vt] = _viewList.size()-1;

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(_viewList.size()-1, 0);
    }
    
    /* Adding the  view for the entire subtree to the cache */ 
    _cache[t] = viewAggregatePair;
    
    /* Return ID of this view */  
    return viewAggregatePair;    
}